

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_CONTEXT *target_local;
  
  target_local._4_4_ = UINT64_Unmarshal(&target->sequence,buffer,size);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = TPMI_DH_CONTEXT_Unmarshal(&target->savedHandle,buffer,size),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPM2B_CONTEXT_DATA_Unmarshal(&target->contextBlob,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->sequence), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_DH_CONTEXT_Unmarshal((TPMI_DH_CONTEXT *)&(target->savedHandle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_CONTEXT_DATA_Unmarshal((TPM2B_CONTEXT_DATA *)&(target->contextBlob), buffer, size);
    return result;
}